

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O3

GLuint __thiscall
glcts::FormatInfo::countAlignedSize(FormatInfo *this,GLuint offsetAlignment,GLuint totalSize)

{
  uint uVar1;
  
  if ((offsetAlignment < totalSize) &&
     (uVar1 = totalSize % offsetAlignment, offsetAlignment = (offsetAlignment + totalSize) - uVar1,
     uVar1 == 0)) {
    offsetAlignment = totalSize;
  }
  return offsetAlignment;
}

Assistant:

glw::GLuint FormatInfo::countAlignedSize(glw::GLuint offsetAlignment, glw::GLuint totalSize)
{
	if (totalSize > offsetAlignment)
	{
		glw::GLuint rest = totalSize % offsetAlignment;
		if (0 == rest)
		{
			return totalSize;
		}
		return totalSize + offsetAlignment - rest;
	}
	else
	{
		return offsetAlignment;
	}
}